

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  int iVar1;
  Table **ppTVar2;
  Parse *local_38;
  Table **apVtabLock;
  int n;
  int i;
  Parse *pToplevel;
  Table *pTab_local;
  Parse *pParse_local;
  
  local_38 = pParse;
  if (pParse->pToplevel != (Parse *)0x0) {
    local_38 = pParse->pToplevel;
  }
  apVtabLock._4_4_ = 0;
  while( true ) {
    if (local_38->nVtabLock <= apVtabLock._4_4_) {
      ppTVar2 = (Table **)
                sqlite3_realloc64(local_38->apVtabLock,(long)((local_38->nVtabLock + 1) * 8));
      if (ppTVar2 == (Table **)0x0) {
        sqlite3OomFault(local_38->db);
      }
      else {
        local_38->apVtabLock = ppTVar2;
        iVar1 = local_38->nVtabLock;
        local_38->nVtabLock = iVar1 + 1;
        local_38->apVtabLock[iVar1] = pTab;
      }
      return;
    }
    if (pTab == local_38->apVtabLock[apVtabLock._4_4_]) break;
    apVtabLock._4_4_ = apVtabLock._4_4_ + 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3_realloc64(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    sqlite3OomFault(pToplevel->db);
  }
}